

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkCompareCones(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Vec_Ptr_t *pNtk_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *__base;
  Abc_Obj_t **ppNodes;
  Abc_Obj_t *pObj_00;
  int *pPerms;
  int CounterCosNew;
  int CounterCos;
  int Counter;
  int k;
  int i;
  int Iter;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vReverse;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vSupp;
  Abc_Ntk_t *pNtk_local;
  
  vSupp = (Vec_Ptr_t *)pNtk;
  iVar2 = Abc_NtkCoNum(pNtk);
  __base = malloc((long)iVar2 << 2);
  iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)vSupp);
  pSupps = (int *)malloc((long)iVar2 << 2);
  for (Counter = 0; iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)vSupp), Counter < iVar2; Counter = Counter + 1
      ) {
    pTemp = Abc_NtkCo((Abc_Ntk_t *)vSupp,Counter);
    *(int *)((long)__base + (long)Counter * 4) = Counter;
    vNodes = Abc_NtkNodeSupport((Abc_Ntk_t *)vSupp,&pTemp,1);
    iVar2 = Vec_PtrSize(vNodes);
    pSupps[Counter] = iVar2;
    Vec_PtrFree(vNodes);
  }
  iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)vSupp);
  qsort(__base,(long)iVar2,4,Abc_NtkCompareConesCompare);
  k = 0;
  Counter = 0;
  do {
    iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)vSupp);
    if (iVar2 <= Counter) {
LAB_0020d934:
      for (Counter = 0; iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)vSupp), Counter < iVar2;
          Counter = Counter + 1) {
        pTemp = Abc_NtkCo((Abc_Ntk_t *)vSupp,Counter);
        *(uint *)&pTemp->field_0x14 = *(uint *)&pTemp->field_0x14 & 0xffffffef;
      }
      if (__base != (void *)0x0) {
        free(__base);
      }
      if (pSupps != (int *)0x0) {
        free(pSupps);
        pSupps = (int *)0x0;
      }
      return;
    }
    pTemp = Abc_NtkCo((Abc_Ntk_t *)vSupp,Counter);
    pTemp = Abc_NtkCo((Abc_Ntk_t *)vSupp,*(int *)((long)__base + (long)Counter * 4));
    if ((*(uint *)&pTemp->field_0x14 >> 4 & 1) == 0) {
      k = k + 1;
      vNodes = Abc_NtkNodeSupport((Abc_Ntk_t *)vSupp,&pTemp,1);
      vReverse = Abc_NtkDfsNodes((Abc_Ntk_t *)vSupp,&pTemp,1);
      pNtk_00 = vSupp;
      ppNodes = (Abc_Obj_t **)Vec_PtrArray(vNodes);
      iVar2 = Vec_PtrSize(vNodes);
      pObj = (Abc_Obj_t *)Abc_NtkDfsReverseNodesContained((Abc_Ntk_t *)pNtk_00,ppNodes,iVar2);
      CounterCosNew = 0;
      for (CounterCos = 1; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj), CounterCos < iVar2 + -1;
          CounterCos = CounterCos + 1) {
        for (_i = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,CounterCos); _i != (Abc_Obj_t *)0x0;
            _i = *(Abc_Obj_t **)((long)_i + 0x40)) {
          CounterCosNew = CounterCosNew + 1;
        }
      }
      pPerms._0_4_ = 0;
      pPerms._4_4_ = 0;
      for (_i = (Abc_Obj_t *)Vec_PtrEntryLast((Vec_Ptr_t *)pObj); _i != (Abc_Obj_t *)0x0;
          _i = (_i->field_6).pCopy) {
        iVar2 = Abc_ObjIsCo(_i);
        if (iVar2 == 0) {
          __assert_fail("Abc_ObjIsCo(pTemp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                        ,0x858,"void Abc_NtkCompareCones(Abc_Ntk_t *)");
        }
        pPerms._4_4_ = pPerms._4_4_ + 1;
        if ((*(uint *)&_i->field_0x14 >> 4 & 1) == 0) {
          pPerms._0_4_ = (int)pPerms + 1;
        }
        *(uint *)&_i->field_0x14 = *(uint *)&_i->field_0x14 & 0xffffffef | 0x10;
      }
      uVar1 = *(uint *)((long)__base + (long)Counter * 4);
      uVar3 = Vec_PtrSize(vNodes);
      pObj_00 = Abc_ObjFanin0(pTemp);
      uVar4 = Abc_ObjLevel(pObj_00);
      uVar5 = Vec_PtrSize(vReverse);
      printf("%4d CO %5d :  Supp = %5d.  Lev = %3d.  Cone = %5d.  Rev = %5d.  COs = %3d (%3d).\n",
             (ulong)(uint)k,(ulong)uVar1,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,CounterCosNew,
             pPerms._4_4_,(int)pPerms);
      iVar2 = Vec_PtrSize(vNodes);
      if (iVar2 < 10) {
        Vec_PtrFree(vNodes);
        Vec_PtrFree(vReverse);
        Vec_PtrFree((Vec_Ptr_t *)pObj);
        goto LAB_0020d934;
      }
      Vec_PtrFree(vNodes);
      Vec_PtrFree(vReverse);
      Vec_PtrFree((Vec_Ptr_t *)pObj);
    }
    Counter = Counter + 1;
  } while( true );
}

Assistant:

void Abc_NtkCompareCones( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp, * vNodes, * vReverse;
    Abc_Obj_t * pObj, * pTemp;
    int Iter, i, k, Counter, CounterCos, CounterCosNew;
    int * pPerms;

    // sort COs by support size
    pPerms = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    pSupps = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pPerms[i] = i;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        pSupps[i] = Vec_PtrSize(vSupp);
        Vec_PtrFree( vSupp );
    }
    qsort( (void *)pPerms, Abc_NtkCoNum(pNtk), sizeof(int), (int (*)(const void *, const void *)) Abc_NtkCompareConesCompare );

    // consider COs in this order
    Iter = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pObj = Abc_NtkCo( pNtk, pPerms[i] );
        if ( pObj->fMarkA )
            continue;
        Iter++;

        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vNodes = Abc_NtkDfsNodes( pNtk, &pObj, 1 );
        vReverse = Abc_NtkDfsReverseNodesContained( pNtk, (Abc_Obj_t **)Vec_PtrArray(vSupp), Vec_PtrSize(vSupp) );
        // count the number of nodes in the reverse cone
        Counter = 0;
        for ( k = 1; k < Vec_PtrSize(vReverse) - 1; k++ )
            for ( pTemp = (Abc_Obj_t *)Vec_PtrEntry(vReverse, k); pTemp; pTemp = (Abc_Obj_t *)pTemp->pCopy )
                Counter++;
        CounterCos = CounterCosNew = 0;
        for ( pTemp = (Abc_Obj_t *)Vec_PtrEntryLast(vReverse); pTemp; pTemp = (Abc_Obj_t *)pTemp->pCopy )
        {
            assert( Abc_ObjIsCo(pTemp) );
            CounterCos++;
            if ( pTemp->fMarkA == 0 )
                CounterCosNew++;
            pTemp->fMarkA = 1;
        }
        // print statistics
        printf( "%4d CO %5d :  Supp = %5d.  Lev = %3d.  Cone = %5d.  Rev = %5d.  COs = %3d (%3d).\n",
            Iter, pPerms[i], Vec_PtrSize(vSupp), Abc_ObjLevel(Abc_ObjFanin0(pObj)), Vec_PtrSize(vNodes), Counter, CounterCos, CounterCosNew );

        if ( Vec_PtrSize(vSupp) < 10 )
        {
            // free arrays
            Vec_PtrFree( vSupp );
            Vec_PtrFree( vNodes );
            Vec_PtrFree( vReverse );
            break;
        }

        // free arrays
        Vec_PtrFree( vSupp );
        Vec_PtrFree( vNodes );
        Vec_PtrFree( vReverse );

    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->fMarkA = 0;

    ABC_FREE( pPerms );
    ABC_FREE( pSupps );
}